

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

int duckdb_shell_sqlite3_prepare_v2
              (sqlite3 *db,char *zSql,int nByte,sqlite3_stmt **ppStmt,char **pzTail)

{
  idx_t iVar1;
  ParserOptions options_p;
  char *pcVar2;
  bool bVar3;
  long lVar4;
  size_type sVar5;
  pointer pSVar6;
  ulong uVar7;
  ulong uVar8;
  pointer pMVar9;
  pointer psVar10;
  pointer this;
  pointer pPVar11;
  size_type sVar12;
  undefined8 *in_RCX;
  int in_EDX;
  char *in_RSI;
  sqlite3 *in_RDI;
  long *in_R8;
  string *in_stack_000000e8;
  Parser *in_stack_000000f0;
  exception *ex;
  idx_t i_1;
  unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
  pending;
  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
  prepared;
  unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> stmt;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  res;
  idx_t i;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  statements;
  bool set_remainder;
  idx_t next_location;
  Parser parser;
  string query;
  ErrorData *__x;
  shared_ptr<duckdb::ClientContext,_true> *in_stack_fffffffffffffbe0;
  ErrorData *this_00;
  LogicalType *type;
  ClientContext *in_stack_fffffffffffffbf0;
  undefined7 in_stack_fffffffffffffbf8;
  LogicalTypeId in_stack_fffffffffffffbff;
  LogicalType *in_stack_fffffffffffffc00;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  *in_stack_fffffffffffffc08;
  ClientContext *in_stack_fffffffffffffc10;
  Connection *in_stack_fffffffffffffc18;
  undefined1 allow_stream_result;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
  *in_stack_fffffffffffffc20;
  Connection *in_stack_fffffffffffffc28;
  unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
  *in_stack_fffffffffffffc30;
  Connection *in_stack_fffffffffffffc38;
  string local_168 [32];
  string local_148 [32];
  ulong local_128;
  long local_e8;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_e0;
  byte local_c1;
  ulong local_c0;
  uint local_b4;
  ErrorData *local_b0;
  ErrorData *pEStack_a8;
  LogicalType *local_a0;
  vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
  local_98 [2];
  byte local_66;
  allocator local_65 [19];
  byte local_52;
  allocator local_51;
  string local_50 [32];
  long *local_30;
  undefined8 *local_28;
  char *local_18;
  sqlite3 *local_10;
  int local_4;
  
  if (((in_RDI == (sqlite3 *)0x0) || (in_RCX == (undefined8 *)0x0)) || (in_RSI == (char *)0x0)) {
    local_4 = 0x15;
  }
  else {
    *in_RCX = 0;
    local_52 = 0;
    local_66 = 0;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if (in_EDX < 0) {
      std::allocator<char>::allocator();
      local_52 = 1;
      std::__cxx11::string::string(local_50,in_RSI,&local_51);
    }
    else {
      std::allocator<char>::allocator();
      local_66 = 1;
      std::__cxx11::string::string(local_50,in_RSI,(long)in_EDX,local_65);
    }
    if ((local_66 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)local_65);
    }
    if ((local_52 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
    pcVar2 = local_18;
    if (local_30 != (long *)0x0) {
      lVar4 = std::__cxx11::string::size();
      *local_30 = (long)(pcVar2 + lVar4);
    }
    duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
    operator->((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
               in_stack_fffffffffffffbe0);
    duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->(in_stack_fffffffffffffbe0);
    duckdb::ClientContext::GetParserOptions(in_stack_fffffffffffffbf0);
    options_p.max_expression_depth._0_7_ = in_stack_fffffffffffffbf8;
    options_p._0_8_ = in_stack_fffffffffffffbf0;
    options_p.max_expression_depth._7_1_ = in_stack_fffffffffffffbff;
    options_p.extensions = (vector<duckdb::ParserExtension,_true> *)in_stack_fffffffffffffc00;
    duckdb::Parser::Parser((Parser *)pEStack_a8,options_p);
    duckdb::Parser::ParseQuery(in_stack_000000f0,in_stack_000000e8);
    sVar5 = std::
            vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
            ::size(local_98);
    if (sVar5 == 0) {
      local_4 = 0;
      local_b4 = 1;
    }
    else {
      duckdb::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                    *)pEStack_a8,(size_type)local_b0);
      pSVar6 = duckdb::
               unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                           *)pEStack_a8);
      iVar1 = pSVar6->stmt_location;
      duckdb::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                    *)pEStack_a8,(size_type)local_b0);
      pSVar6 = duckdb::
               unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
               operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                           *)pEStack_a8);
      uVar7 = iVar1 + pSVar6->stmt_length;
      local_c0 = uVar7;
      uVar8 = std::__cxx11::string::size();
      local_c1 = uVar7 < uVar8;
      duckdb::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
      ::vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                *)0x29f4717);
      duckdb::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                    *)pEStack_a8,(size_type)local_b0);
      std::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
      ::push_back((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                   *)pEStack_a8,(value_type *)local_b0);
      duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
      operator->((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
                 pEStack_a8);
      duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->
                ((shared_ptr<duckdb::ClientContext,_true> *)pEStack_a8);
      duckdb::ClientContext::HandlePragmaStatements
                (in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
      bVar3 = std::
              vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
              ::empty((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                       *)in_stack_fffffffffffffbf0);
      if (bVar3) {
        local_4 = 0;
        local_b4 = 1;
      }
      else {
        __x = local_b0;
        this_00 = pEStack_a8;
        type = local_a0;
        for (local_e8 = 0; uVar7 = local_e8 + 1,
            sVar5 = std::
                    vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>_>_>
                    ::size(&local_e0), uVar7 < sVar5; local_e8 = local_e8 + 1) {
          duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
          operator->((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
                      *)this_00);
          duckdb::
          vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
          ::operator[]((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                        *)this_00,(size_type)__x);
          duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          ::unique_ptr((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                        *)this_00,
                       (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                        *)__x);
          duckdb::Connection::Query(in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
          duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          ::~unique_ptr((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)0x29f489d);
          pMVar9 = duckdb::
                   unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                                 *)this_00);
          bVar3 = duckdb::BaseQueryResult::HasError((BaseQueryResult *)pMVar9);
          if (bVar3) {
            pMVar9 = duckdb::
                     unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                     ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                                   *)this_00);
            duckdb::BaseQueryResult::GetErrorObject((BaseQueryResult *)pMVar9);
            duckdb::ErrorData::operator=(this_00,__x);
            local_4 = 1;
          }
          local_b4 = (uint)bVar3;
          duckdb::
          unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
          ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                         *)0x29f499f);
          if (local_b4 != 0) goto LAB_029f50f8;
        }
        duckdb::make_uniq<sqlite3_stmt>();
        psVar10 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                  operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                             this_00);
        psVar10->db = local_10;
        psVar10 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                  operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                             this_00);
        std::__cxx11::string::operator=((string *)&psVar10->query_string,local_50);
        duckdb::
        vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
        ::back(in_stack_fffffffffffffc20);
        duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
        operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                    *)this_00);
        bVar3 = std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                ::empty((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         *)0x29f4a85);
        if (bVar3) {
          duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
          operator->((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
                      *)this_00);
          allow_stream_result = (undefined1)((ulong)in_stack_fffffffffffffc18 >> 0x38);
          duckdb::
          vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
          ::back(in_stack_fffffffffffffc20);
          duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          ::unique_ptr((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                        *)this_00,
                       (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                        *)__x);
          duckdb::Connection::PendingQuery
                    (in_stack_fffffffffffffc28,
                     (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      *)in_stack_fffffffffffffc20,(bool)allow_stream_result);
          duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          ::~unique_ptr((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)0x29f4cd6);
          pPVar11 = duckdb::
                    unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                    ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                  *)this_00);
          bVar3 = duckdb::BaseQueryResult::HasError(&pPVar11->super_BaseQueryResult);
          if (bVar3) {
            pPVar11 = duckdb::
                      unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                      ::operator->((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                                    *)this_00);
            duckdb::BaseQueryResult::GetErrorObject(&pPVar11->super_BaseQueryResult);
            duckdb::ErrorData::operator=(this_00,__x);
            local_4 = 1;
          }
          else {
            duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::operator->
                      ((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)this_00)
            ;
            duckdb::
            unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
            ::operator=((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)this_00,
                        (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)__x);
          }
          local_b4 = (uint)bVar3;
          duckdb::
          unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
          ::~unique_ptr((unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
                         *)0x29f4e05);
        }
        else {
          duckdb::unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::
          operator->((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
                      *)this_00);
          duckdb::
          vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
          ::back(in_stack_fffffffffffffc20);
          duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          ::unique_ptr((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                        *)this_00,
                       (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                        *)__x);
          duckdb::Connection::Prepare
                    (in_stack_fffffffffffffc18,
                     (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                      *)in_stack_fffffffffffffc10);
          duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          ::~unique_ptr((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)0x29f4b08);
          this = duckdb::
                 unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                 ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                               *)this_00);
          bVar3 = duckdb::PreparedStatement::HasError(this);
          if (bVar3) {
            duckdb::
            unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
            ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                          *)this_00);
            duckdb::ErrorData::operator=(this_00,__x);
            local_4 = 1;
          }
          else {
            duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::operator->
                      ((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)this_00)
            ;
            duckdb::
            unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
            ::operator=((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                         *)this_00,
                        (unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                         *)__x);
          }
          local_b4 = (uint)bVar3;
          duckdb::
          unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
          ::~unique_ptr((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                         *)0x29f4c43);
        }
        if (local_b4 == 0) {
          psVar10 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                    operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                               this_00);
          psVar10->current_row = -1;
          duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::operator->
                    ((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)this_00);
          bVar3 = std::
                  unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                  ::operator_bool((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>_>
                                   *)0x29f4e5b);
          if (bVar3) {
            local_128 = 0;
            while( true ) {
              uVar7 = local_128;
              duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::operator->
                        ((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                         this_00);
              duckdb::
              unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
              ::operator->((unique_ptr<duckdb::PreparedStatement,_std::default_delete<duckdb::PreparedStatement>,_true>
                            *)this_00);
              sVar12 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       ::size((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                               *)0x29f4eb7);
              if (sVar12 <= uVar7) break;
              psVar10 = duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::
                        operator->((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>
                                    *)this_00);
              std::__cxx11::to_string((unsigned_long)&psVar10->bound_names);
              std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
                        ((char *)type,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         this_00);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)this_00,(value_type *)__x);
              std::__cxx11::string::~string(local_148);
              std::__cxx11::string::~string(local_168);
              duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::operator->
                        ((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)
                         this_00);
              duckdb::LogicalType::LogicalType(in_stack_fffffffffffffc00,in_stack_fffffffffffffbff);
              duckdb::Value::Value((Value *)in_stack_fffffffffffffbf0,type);
              std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                        ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)this_00,
                         (value_type *)__x);
              duckdb::Value::~Value((Value *)this_00);
              duckdb::LogicalType::~LogicalType((LogicalType *)0x29f4fcb);
              local_128 = local_128 + 1;
            }
          }
          if ((local_30 != (long *)0x0) && ((local_c1 & 1) != 0)) {
            *local_30 = (long)(local_18 + local_c0 + 1);
          }
          psVar10 = std::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_>::release
                              ((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>_> *)
                               0x29f50b6);
          *local_28 = psVar10;
          local_4 = 0;
          local_b4 = 1;
        }
        duckdb::unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true>::~unique_ptr
                  ((unique_ptr<sqlite3_stmt,_std::default_delete<sqlite3_stmt>,_true> *)0x29f50e7);
      }
LAB_029f50f8:
      duckdb::
      vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
      ::~vector((vector<duckdb::unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>,_true>
                 *)0x29f5105);
    }
    duckdb::Parser::~Parser((Parser *)0x29f5123);
    std::__cxx11::string::~string(local_50);
  }
  return local_4;
}

Assistant:

int sqlite3_prepare_v2(sqlite3 *db,           /* Database handle */
                       const char *zSql,      /* SQL statement, UTF-8 encoded */
                       int nByte,             /* Maximum length of zSql in bytes. */
                       sqlite3_stmt **ppStmt, /* OUT: Statement handle */
                       const char **pzTail    /* OUT: Pointer to unused portion of zSql */
) {
	if (!db || !ppStmt || !zSql) {
		return SQLITE_MISUSE;
	}
	*ppStmt = nullptr;
	string query = nByte < 0 ? zSql : string(zSql, nByte);
	if (pzTail) {
		*pzTail = zSql + query.size();
	}
	try {
		Parser parser(db->con->context->GetParserOptions());
		parser.ParseQuery(query);
		if (parser.statements.size() == 0) {
			return SQLITE_OK;
		}
		// extract the remainder
		idx_t next_location = parser.statements[0]->stmt_location + parser.statements[0]->stmt_length;
		bool set_remainder = next_location < query.size();

		// extract the first statement
		duckdb::vector<duckdb::unique_ptr<SQLStatement>> statements;
		statements.push_back(std::move(parser.statements[0]));

		db->con->context->HandlePragmaStatements(statements);
		if (statements.empty()) {
			return SQLITE_OK;
		}

		// if there are multiple statements here, we are dealing with an import database statement
		// we directly execute all statements besides the final one
		for (idx_t i = 0; i + 1 < statements.size(); i++) {
			auto res = db->con->Query(std::move(statements[i]));
			if (res->HasError()) {
				db->last_error = res->GetErrorObject();
				return SQLITE_ERROR;
			}
		}

		// create the statement entry
		duckdb::unique_ptr<sqlite3_stmt> stmt = make_uniq<sqlite3_stmt>();
		stmt->db = db;
		stmt->query_string = query;

		if (!statements.back()->named_param_map.empty()) {
			// Use Prepare: there are parameters
			auto prepared = db->con->Prepare(std::move(statements.back()));
			if (prepared->HasError()) {
				// failed to prepare: set the error message
				db->last_error = prepared->error;
				return SQLITE_ERROR;
			}
			stmt->prepared = std::move(prepared);
		} else {
			// Use eager execution: there are no parameters so we can safely create a PendingQuery here
			auto pending = db->con->PendingQuery(std::move(statements.back()), false);
			if (pending->HasError()) {
				// failed to prepare: set the error message
				db->last_error = pending->GetErrorObject();
				return SQLITE_ERROR;
			}
			stmt->pending = std::move(pending);
		}

		stmt->current_row = -1;

		if (stmt->prepared) {
			for (idx_t i = 0; i < stmt->prepared->named_param_map.size(); i++) {
				stmt->bound_names.push_back("$" + to_string(i + 1));
				stmt->bound_values.push_back(Value());
			}
		}

		// extract the remainder of the query and assign it to the pzTail
		if (pzTail && set_remainder) {
			*pzTail = zSql + next_location + 1;
		}

		*ppStmt = stmt.release();
		return SQLITE_OK;
	} catch (std::exception &ex) {
		db->last_error = ErrorData(ex);
		db->con->context->ProcessError(db->last_error, query);
		return SQLITE_ERROR;
	}
}